

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void rest_regions(memfile *mf,level *lev,boolean ghostly)

{
  short sVar1;
  int8_t iVar2;
  boolean bVar3;
  ushort uVar4;
  int16_t iVar5;
  int16_t iVar6;
  int32_t iVar7;
  uint uVar8;
  region **pprVar9;
  region *prVar10;
  nhrect *pnVar11;
  uint *puVar12;
  char *pcVar13;
  long lVar14;
  short sVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint *nidp;
  int iVar21;
  
  free_regions(lev);
  mfmagic_check(mf,0x49474552);
  iVar7 = mread32(mf);
  lVar14 = (ulong)moves - (long)iVar7;
  if (ghostly != '\0') {
    lVar14 = 0;
  }
  uVar8 = mread32(mf);
  lev->n_regions = uVar8;
  lev->max_regions = uVar8;
  if (0 < (int)uVar8) {
    pprVar9 = (region **)malloc((ulong)uVar8 << 3);
    lev->regions = pprVar9;
  }
  for (lVar18 = 0; lVar18 < (int)uVar8; lVar18 = lVar18 + 1) {
    prVar10 = (region *)malloc(0x58);
    lev->regions[lVar18] = prVar10;
    prVar10 = lev->regions[lVar18];
    prVar10->n_monst = 0;
    prVar10->max_monst = 0;
    prVar10->visible = '\0';
    *(undefined3 *)&prVar10->field_0x4d = 0;
    prVar10->effect_id = 0;
    prVar10->arg = 0;
    prVar10->can_leave_f = 0;
    prVar10->leave_f = 0;
    prVar10->inside_f = 0;
    prVar10->player_flags = '\0';
    prVar10->field_0x3f = 0;
    prVar10->monsters = (uint *)0x0;
    prVar10->leave_msg = (char *)0x0;
    prVar10->ttl = 0;
    prVar10->expire_f = 0;
    prVar10->can_enter_f = 0;
    prVar10->enter_f = 0;
    *(undefined8 *)&prVar10->attach_2_m = 0;
    prVar10->enter_msg = (char *)0x0;
    prVar10->rects = (nhrect *)0x0;
    (prVar10->bounding_box).lx = '\0';
    (prVar10->bounding_box).ly = '\0';
    (prVar10->bounding_box).hx = '\0';
    (prVar10->bounding_box).hy = '\0';
    prVar10->nrects = 0;
    prVar10->attach_2_u = '\0';
    prVar10->field_0x17 = 0;
    prVar10->lev = lev;
    mread(mf,&prVar10->bounding_box,4);
    uVar8 = mread32(mf);
    prVar10->attach_2_m = uVar8;
    iVar7 = mread32(mf);
    prVar10->effect_id = iVar7;
    iVar7 = mread32(mf);
    prVar10->arg = iVar7;
    uVar4 = mread16(mf);
    prVar10->nrects = uVar4;
    if (0 < (short)uVar4) {
      pnVar11 = (nhrect *)malloc((ulong)uVar4 << 2);
      prVar10->rects = pnVar11;
    }
    lVar16 = 0;
    for (lVar20 = 0; lVar20 < (short)uVar4; lVar20 = lVar20 + 1) {
      mread(mf,&prVar10->rects->lx + lVar16,4);
      uVar4 = prVar10->nrects;
      lVar16 = lVar16 + 4;
    }
    iVar5 = mread16(mf);
    prVar10->ttl = iVar5;
    iVar5 = mread16(mf);
    prVar10->expire_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->can_enter_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->enter_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->can_leave_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->leave_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->inside_f = iVar5;
    iVar5 = mread16(mf);
    prVar10->n_monst = iVar5;
    prVar10->max_monst = iVar5;
    iVar2 = mread8(mf);
    prVar10->player_flags = iVar2;
    iVar2 = mread8(mf);
    prVar10->attach_2_u = iVar2;
    iVar2 = mread8(mf);
    prVar10->visible = iVar2;
    uVar17 = (ulong)prVar10->n_monst;
    if (0 < (long)uVar17) {
      puVar12 = (uint *)malloc(uVar17 * 4);
      prVar10->monsters = puVar12;
    }
    for (lVar16 = 0; lVar16 < (short)uVar17; lVar16 = lVar16 + 1) {
      uVar8 = mread32(mf);
      prVar10->monsters[lVar16] = uVar8;
      uVar17 = (ulong)(ushort)prVar10->n_monst;
    }
    iVar5 = mread16(mf);
    iVar6 = mread16(mf);
    if (iVar5 != 0) {
      uVar8 = (uint)iVar5;
      pcVar13 = (char *)malloc((ulong)uVar8);
      mread(mf,pcVar13,uVar8);
      pcVar13[uVar8 - 1] = '\0';
      prVar10->enter_msg = pcVar13;
    }
    if (iVar6 != 0) {
      uVar8 = (uint)iVar6;
      pcVar13 = (char *)malloc((ulong)uVar8);
      mread(mf,pcVar13,uVar8);
      pcVar13[uVar8 - 1] = '\0';
      prVar10->leave_msg = pcVar13;
    }
    sVar1 = prVar10->ttl;
    if (-1 < (long)sVar1) {
      sVar15 = sVar1 - (short)lVar14;
      if (sVar1 <= lVar14) {
        sVar15 = 0;
      }
      prVar10->ttl = sVar15;
    }
    if (ghostly != '\0') {
      prVar10->player_flags = prVar10->player_flags & 0xfcU | 2;
    }
    uVar8 = lev->n_regions;
  }
  uVar17 = (ulong)uVar8;
LAB_00223afc:
  do {
    while( true ) {
      if ((int)uVar17 < 1) {
        return;
      }
      prVar10 = lev->regions[uVar17 - 1];
      uVar17 = uVar17 - 1;
      if (prVar10->ttl != 0) break;
      remove_region(prVar10);
    }
  } while ((ghostly == '\0') || (iVar19 = (int)prVar10->n_monst, prVar10->n_monst < 1));
  puVar12 = prVar10->monsters;
  iVar21 = 0;
  do {
    nidp = puVar12 + iVar21;
    while( true ) {
      if (iVar19 <= iVar21) {
        prVar10->n_monst = (short)iVar19;
        goto LAB_00223afc;
      }
      bVar3 = lookup_id_mapping(*nidp,nidp);
      if (bVar3 == '\0') break;
      iVar21 = iVar21 + 1;
      nidp = nidp + 1;
    }
    lVar14 = (long)iVar19;
    iVar19 = iVar19 + -1;
    *nidp = puVar12[lVar14 + -1];
  } while( true );
}

Assistant:

void rest_regions(struct memfile *mf, struct level *lev,
		  boolean ghostly) /* If a bones file restore */
{
    int i, j;
    unsigned len1, len2;
    long tmstamp;
    char *msg_buf;
    struct region *r;

    free_regions(lev);		/* Just for security */
    mfmagic_check(mf, REGION_MAGIC);
    tmstamp = mread32(mf);
    if (ghostly)
	tmstamp = 0;
    else
	tmstamp = (moves - tmstamp);
    lev->n_regions = mread32(mf);
    lev->max_regions = lev->n_regions;
    if (lev->n_regions > 0)
	lev->regions = malloc(sizeof (struct region *) * lev->n_regions);
    
    for (i = 0; i < lev->n_regions; i++) {
	lev->regions[i] = malloc(sizeof (struct region));
	
	r = lev->regions[i];
	memset(r, 0, sizeof(struct region));
	
	r->lev = lev;
	
	mread(mf, &r->bounding_box, sizeof (struct nhrect));
	r->attach_2_m = mread32(mf);
	r->effect_id = mread32(mf);
	r->arg = mread32(mf);
	r->nrects = mread16(mf);
	if (r->nrects > 0)
	    r->rects = malloc(sizeof (struct nhrect) * r->nrects);
	for (j = 0; j < r->nrects; j++)
	    mread(mf, &r->rects[j], sizeof (struct nhrect));
	r->ttl = mread16(mf);
	r->expire_f = mread16(mf);
	r->can_enter_f = mread16(mf);
	r->enter_f = mread16(mf);
	r->can_leave_f = mread16(mf);
	r->leave_f = mread16(mf);
	r->inside_f = mread16(mf);
	r->n_monst = mread16(mf);
	r->max_monst = r->n_monst;
	r->player_flags = mread8(mf);
	r->attach_2_u = mread8(mf);
	r->visible = mread8(mf);
	
	if (r->n_monst > 0)
	    r->monsters = malloc(sizeof (unsigned) * r->n_monst);
	for (j = 0; j < r->n_monst; j++)
	    r->monsters[j] = mread32(mf);
	
	len1 = mread16(mf);
	len2 = mread16(mf);
	
	if (len1 > 0) {
	    msg_buf = malloc(len1);
	    mread(mf, msg_buf, len1);
	    msg_buf[len1 - 1] = '\0';
	    r->enter_msg = msg_buf;
	}
	
	if (len2 > 0) {
	    msg_buf = malloc(len2);
	    mread(mf, msg_buf, len2);
	    msg_buf[len2 - 1] = '\0';
	    r->leave_msg = msg_buf;
	}

	/* check for expired region */
	if (r->ttl >= 0)
	    r->ttl = (r->ttl > tmstamp) ? r->ttl - tmstamp : 0;
	
	if (ghostly) {	/* settings pertained to old player */
	    clear_hero_inside(r);
	    clear_heros_fault(r);
	}
    }
    /* remove expired lev->regions, do not trigger the expire_f callback (yet!);
       also update monster lists if this data is coming from a bones file */
    for (i = lev->n_regions - 1; i >= 0; i--)
	if (lev->regions[i]->ttl == 0)
	    remove_region(lev->regions[i]);
	else if (ghostly && lev->regions[i]->n_monst > 0)
	    reset_region_mids(lev->regions[i]);
}